

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libbrain.h
# Opt level: O3

int libbrain::
    state<11U,_(libbrain::bfop)1,_(libbrain::bfop)6,_(libbrain::bfop)0,_(libbrain::bfop)7,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)7,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)8,_(libbrain::bfop)2,_(libbrain::bfop)4,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)2,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)4,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)4,_(libbrain::bfop)3,_(libbrain::bfop)4,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)4,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)3,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)9>
    ::exec(uchar *data,uint data_ptr,FILE *output,FILE *input)

{
  int iVar1;
  
  data[data_ptr] = data[data_ptr] + 0xff;
  iVar1 = state<13U,_(libbrain::bfop)1,_(libbrain::bfop)6,_(libbrain::bfop)0,_(libbrain::bfop)7,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)7,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)8,_(libbrain::bfop)2,_(libbrain::bfop)4,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)2,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)4,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)4,_(libbrain::bfop)3,_(libbrain::bfop)4,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)4,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)3,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)9>
          ::exec(data,data_ptr + 1,output,input);
  return iVar1;
}

Assistant:

static constexpr inline int exec(unsigned char data[], unsigned int data_ptr, FILE* output, FILE* input) {
            #ifdef LIBBRAIN_BUILD_WITH_DEBUG

            fprintf(stderr, "MINUS instruction reached at %i, data_ptr = %i\n", ins_ptr, data_ptr);

            #endif

            data[data_ptr]--;
            return state<ins_ptr + 1, op_at<ins_ptr + 1, op, ops...>::operation, op, ops...>
                    ::exec(data, data_ptr, output, input);
        }